

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void slot_error(char *error_string,Am_Object_Data *object_data,Am_Slot_Key key)

{
  uint *puVar1;
  size_t sVar2;
  Am_Object object;
  Am_Object local_20;
  
  puVar1 = &(object_data->super_Am_Wrapper).refs;
  *puVar1 = *puVar1 + 1;
  local_20.data = object_data;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"** ",3);
  if (error_string == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2f8770);
  }
  else {
    sVar2 = strlen(error_string);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,error_string,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  Object = ",0xb);
  if (local_20.data == (Am_Object_Data *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(0L) Object",0xb);
  }
  else {
    (*((local_20.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[2])
              (local_20.data,&std::cerr);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", Slot = ",9);
  Am_Print_Key((ostream *)&std::cerr,key);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,".",1);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  if (Am_Object_Debugger != (_func_void_Am_Object_ptr_Am_Slot_Key *)0x0) {
    (*Am_Object_Debugger)(&local_20,key);
  }
  Am_Error();
}

Assistant:

void
slot_error(const char *error_string, Am_Object_Data *object_data,
           Am_Slot_Key key)
{
  object_data->Note_Reference();
  Am_Object object = object_data;
  std::cerr << "** " << error_string << "  Object = " << object << ", Slot = ";
  Am_Print_Key(std::cerr, key);
  std::cerr << "." << std::endl;
  Am_Error(object, key);
}